

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall
QTextDocumentPrivate::changeObjectFormat(QTextDocumentPrivate *this,QTextObject *obj,int format)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  QTextFrame *this_00;
  long in_FS_OFFSET;
  QTextUndoCommand local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->editBlock;
  this->editBlock = iVar1 + 1;
  if (iVar1 == 0) {
    this->revision = this->revision + 1;
  }
  iVar1 = QTextObject::objectIndex(obj);
  iVar2 = QTextFormatCollection::objectFormatIndex(&this->formats,iVar1);
  QTextFormatCollection::setObjectFormatIndex(&this->formats,iVar1,format);
  lVar5 = QMetaObject::cast((QObject *)&QTextBlockGroup::staticMetaObject);
  if (lVar5 != 0) {
    QTextBlockGroupPrivate::markBlocksDirty(*(QTextBlockGroupPrivate **)(lVar5 + 8));
  }
  this_00 = (QTextFrame *)QMetaObject::cast((QObject *)&QTextFrame::staticMetaObject);
  if (this_00 != (QTextFrame *)0x0) {
    iVar1 = QTextFrame::firstPosition(this_00);
    iVar3 = QTextFrame::lastPosition(this_00);
    iVar4 = QTextFrame::firstPosition(this_00);
    documentChange(this,iVar1,iVar3 - iVar4);
  }
  local_58.command = 8;
  local_58._2_1_ = this->editBlock != 0;
  local_58.operation = '\x01';
  local_58.strPos = 0;
  local_58.pos = 0;
  local_58.field_8._4_4_ = 0xaaaaaaaa;
  local_58.field_8.blockFormat = *(undefined4 *)(*(long *)&obj->field_0x8 + 0x80);
  local_58.revision = 0;
  local_58._28_4_ = 0xaaaaaaaa;
  local_58.format = iVar2;
  appendUndoItem(this,&local_58);
  endEditBlock(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::changeObjectFormat(QTextObject *obj, int format)
{
    beginEditBlock();
    int objectIndex = obj->objectIndex();
    int oldFormatIndex = formats.objectFormatIndex(objectIndex);
    formats.setObjectFormatIndex(objectIndex, format);

    QTextBlockGroup *b = qobject_cast<QTextBlockGroup *>(obj);
    if (b) {
        b->d_func()->markBlocksDirty();
    }
    QTextFrame *f = qobject_cast<QTextFrame *>(obj);
    if (f)
        documentChange(f->firstPosition(), f->lastPosition() - f->firstPosition());

    QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::GroupFormatChange, (editBlock != 0), QTextUndoCommand::MoveCursor, oldFormatIndex,
                            0, 0, obj->d_func()->objectIndex, 0);
    appendUndoItem(c);

    endEditBlock();
}